

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Minefield_State_PDU::Encode(Minefield_State_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pPVar3;
  pointer pEVar4;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
  local_38;
  const_iterator citrEndTyp;
  const_iterator citrTyp;
  const_iterator citrEndPnt;
  const_iterator citrPnt;
  KDataStream *stream_local;
  Minefield_State_PDU *this_local;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->m_SeqNumUnion).m_ui16SeqNum);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ForceID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumPerimPoints);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_MinefieldType).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumMineTypes);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Loc).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_App).super_DataTypeBase);
  KDataStream::operator<<(pKVar2,(this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16);
  citrEndPnt = std::
               vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
               ::begin(&this->m_vPoints);
  citrTyp._M_current =
       (EntityType *)
       std::
       vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&citrEndPnt,
                       (__normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
                        *)&citrTyp);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
             ::operator->(&citrEndPnt);
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pPVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::PerimeterPointCoordinate_*,_std::vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>_>
    ::operator++(&citrEndPnt);
  }
  citrEndTyp = std::
               vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
               begin(&this->m_vMineTypes);
  local_38._M_current =
       (EntityType *)
       std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::end
                 (&this->m_vMineTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEndTyp,&local_38);
    if (!bVar1) break;
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
             ::operator->(&citrEndTyp);
    (*(pEVar4->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar4,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityType_*,_std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>_>
    ::operator++(&citrEndTyp);
  }
  return;
}

Assistant:

void Minefield_State_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << m_SeqNumUnion.m_ui16SeqNum
           << m_ui8ForceID
           << m_ui8NumPerimPoints
           << KDIS_STREAM m_MinefieldType
           << m_ui16NumMineTypes
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_App
           << m_ui16ProtocolModeUnion.m_ui16ProtocolMode16;

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        citrPnt->Encode( stream );
    }

    std::vector<EntityType>::const_iterator citrTyp = m_vMineTypes.begin();
    std::vector<EntityType>::const_iterator citrEndTyp = m_vMineTypes.end();
    for( ; citrTyp != citrEndTyp; ++citrTyp )
    {
        citrTyp->Encode( stream );
    }
}